

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::TextFlow::Column::const_iterator::const_iterator(const_iterator *this,Column *column)

{
  Column *pCVar1;
  pointer pcVar2;
  size_type sVar3;
  const_iterator local_28;
  
  this->m_column = column;
  local_28.m_it._M_current = (column->m_string).m_string._M_dataplus._M_p;
  local_28.m_string = (string *)column;
  AnsiSkippingString::const_iterator::tryParseAnsiEscapes(&local_28);
  (this->m_lineStart).m_string = local_28.m_string;
  (this->m_lineStart).m_it._M_current = local_28.m_it._M_current;
  local_28.m_it._M_current = (column->m_string).m_string._M_dataplus._M_p;
  local_28.m_string = (string *)column;
  AnsiSkippingString::const_iterator::tryParseAnsiEscapes(&local_28);
  (this->m_lineEnd).m_string = local_28.m_string;
  (this->m_lineEnd).m_it._M_current = local_28.m_it._M_current;
  local_28.m_it._M_current = (column->m_string).m_string._M_dataplus._M_p;
  local_28.m_string = (string *)column;
  AnsiSkippingString::const_iterator::tryParseAnsiEscapes(&local_28);
  (this->m_parsedTo).m_string = local_28.m_string;
  (this->m_parsedTo).m_it._M_current = local_28.m_it._M_current;
  this->m_addHyphen = false;
  calcLength(this);
  if ((this->m_lineStart).m_it._M_current == (this->m_lineEnd).m_it._M_current) {
    pCVar1 = this->m_column;
    pcVar2 = (pCVar1->m_string).m_string._M_dataplus._M_p;
    sVar3 = (pCVar1->m_string).m_string._M_string_length;
    (this->m_lineStart).m_string = (string *)pCVar1;
    (this->m_lineStart).m_it._M_current = pcVar2 + sVar3;
  }
  return;
}

Assistant:

Column::const_iterator::const_iterator( Column const& column ):
            m_column( column ),
            m_lineStart( column.m_string.begin() ),
            m_lineEnd( column.m_string.begin() ),
            m_parsedTo( column.m_string.begin() ) {
            assert( m_column.m_width > m_column.m_indent );
            assert( m_column.m_initialIndent == std::string::npos ||
                    m_column.m_width > m_column.m_initialIndent );
            calcLength();
            if ( m_lineStart == m_lineEnd ) {
                m_lineStart = m_column.m_string.end();
            }
        }